

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZGeoNodeBC_*>::TPZVec(TPZVec<TPZGeoNodeBC_*> *this,initializer_list<TPZGeoNodeBC_*> *list)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  void *pvVar4;
  const_iterator ppTVar5;
  initializer_list<TPZGeoNodeBC_*> *in_RSI;
  undefined8 *in_RDI;
  TPZGeoNodeBC **aux;
  const_iterator it_end;
  const_iterator it;
  size_type size;
  initializer_list<TPZGeoNodeBC_*> *in_stack_ffffffffffffffd0;
  undefined8 *puVar6;
  const_iterator local_20;
  
  *in_RDI = &PTR__TPZVec_023d3448;
  in_RDI[1] = 0;
  sVar2 = std::initializer_list<TPZGeoNodeBC_*>::size(in_RSI);
  if (sVar2 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = sVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    in_RDI[1] = pvVar4;
  }
  local_20 = std::initializer_list<TPZGeoNodeBC_*>::begin(in_RSI);
  ppTVar5 = std::initializer_list<TPZGeoNodeBC_*>::end(in_stack_ffffffffffffffd0);
  puVar6 = (undefined8 *)in_RDI[1];
  for (; local_20 != ppTVar5; local_20 = local_20 + 1) {
    *puVar6 = *local_20;
    puVar6 = puVar6 + 1;
  }
  in_RDI[2] = sVar2;
  in_RDI[3] = sVar2;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}